

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate.c
# Opt level: O2

void xc_rdqagse(integr_fn *f,void *ex,double *a,double *b,double *epsabs,double *epsrel,int *limit,
               double *result,double *abserr,int *neval,int *ier,double *alist__,double *blist,
               double *rlist,double *elist,int *iord,int *last)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  integr_fn *f_00;
  void *ex_00;
  int iVar6;
  long lVar7;
  long lVar8;
  uint *puVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  double *pdVar16;
  long lVar17;
  int *piVar18;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  ulong uVar23;
  ulong uVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  undefined1 auVar40 [16];
  double dVar42;
  undefined1 auVar41 [16];
  double dVar43;
  double dVar44;
  int local_38c;
  int local_37c;
  int local_36c;
  double local_368;
  double local_358;
  double local_350;
  double resabs;
  double local_308;
  undefined8 uStack_300;
  double local_2f8;
  undefined8 uStack_2f0;
  double local_2e8;
  undefined8 uStack_2e0;
  double local_2d8;
  undefined8 uStack_2d0;
  double local_2c8;
  undefined8 uStack_2c0;
  double local_2b0;
  double *local_2a8;
  double *local_2a0;
  integr_fn *local_298;
  void *local_290;
  double error2;
  double error1;
  double defab2;
  double defab1;
  double b2;
  double b1;
  double a2;
  double a1;
  double area2;
  double area1;
  double local_238;
  double dStack_230;
  double dStack_228;
  double local_218;
  undefined8 uStack_210;
  double local_208;
  undefined8 uStack_200;
  double local_1f8;
  double adStack_1f0 [2];
  double defabs;
  double rlist2 [52];
  
  *ier = 0;
  *neval = 0;
  *last = 0;
  *result = 0.0;
  *abserr = 0.0;
  *alist__ = *a;
  *blist = *b;
  *rlist = 0.0;
  *elist = 0.0;
  if ((*epsabs <= 0.0) && (*epsrel <= 1.1102230246251565e-14 && *epsrel != 1.1102230246251565e-14))
  {
    *ier = 6;
    return;
  }
  local_2a8 = a;
  local_2a0 = b;
  local_298 = f;
  local_290 = ex;
  rdqk21(f,ex,a,b,result,abserr,&defabs,&resabs);
  dVar25 = *result;
  local_1f8 = ABS(dVar25);
  adStack_1f0[0] = 0.0;
  dVar28 = *epsrel * local_1f8;
  if (*epsrel * local_1f8 <= *epsabs) {
    dVar28 = *epsabs;
  }
  iVar15 = 1;
  *last = 1;
  *rlist = dVar25;
  local_2c8 = *abserr;
  uVar30 = SUB84(local_2c8,0);
  uVar31 = (undefined4)((ulong)local_2c8 >> 0x20);
  *elist = local_2c8;
  *iord = 1;
  if ((local_2c8 <= defabs * 2.220446049250313e-14) && (dVar28 < local_2c8)) {
    *ier = 2;
  }
  if (*limit == 1) {
LAB_006b3f7b:
    *ier = iVar15;
  }
  else {
    if ((*ier != 0) ||
       (((local_2c8 == 0.0 && (!NAN(local_2c8))) || (resabs != local_2c8 && local_2c8 <= dVar28))))
    goto LAB_006b3f86;
    local_308 = *result;
    uStack_300 = 0;
    *abserr = 1.79769313486232e+308;
    local_2b0 = defabs * 0.9999999999999889;
    local_358 = 0.0;
    iVar15 = 2;
    iVar6 = 0;
    uVar24 = 1;
    uVar12 = 2;
    uVar20 = 1;
    local_38c = 0;
    local_37c = 0;
    iVar10 = 0;
    iVar14 = 0;
    local_36c = 0;
    bVar21 = false;
    bVar22 = false;
    uStack_2c0 = 0;
    local_368 = 0.0;
    local_350 = 0.0;
    local_2d8 = 0.0;
    uStack_2d0 = 0;
    rlist2[0] = local_308;
LAB_006b40af:
    ex_00 = local_290;
    f_00 = local_298;
    *last = iVar15;
    if (iVar15 <= *limit) {
      local_218 = (double)CONCAT44(uVar31,uVar30);
      uStack_210 = 0;
      iVar15 = (int)uVar20;
      local_2f8 = alist__[(long)iVar15 + -1];
      b2 = blist[(long)iVar15 + -1];
      uStack_2f0 = 0;
      local_2e8 = (local_2f8 + b2) * 0.5;
      uStack_2e0 = 0;
      uStack_200 = 0;
      b1 = local_2e8;
      a2 = local_2e8;
      a1 = local_2f8;
      local_208 = b2;
      rdqk21(local_298,local_290,&a1,&b1,&area1,&error1,&resabs,&defab1);
      rdqk21(f_00,ex_00,&a2,&b2,&area2,&error2,&resabs,&defab2);
      dVar28 = area1 + area2;
      uVar30 = SUB84(error2,0);
      uVar31 = (undefined4)((ulong)error2 >> 0x20);
      dVar25 = error1 + error2;
      if ((defab1 != error1) || (NAN(defab1) || NAN(error1))) {
        if ((defab2 == error2) && (!NAN(defab2) && !NAN(error2))) goto LAB_006b430b;
        if ((ABS(rlist[(long)iVar15 + -1] - dVar28) <= ABS(dVar28) * 1e-05) &&
           (local_218 * 0.99 <= dVar25)) {
          iVar14 = iVar14 + (uint)bVar21;
          iVar10 = iVar10 + (uint)!bVar21;
        }
        iVar13 = *last;
        local_36c = local_36c + (uint)(local_218 < dVar25 && 10 < iVar13);
      }
      else {
LAB_006b430b:
        iVar13 = *last;
      }
      local_308 = (local_308 + dVar28) - rlist[(long)iVar15 + -1];
      rlist[(long)iVar15 + -1] = area1;
      rlist[(long)iVar13 + -1] = area2;
      dVar28 = ABS(local_308) * *epsrel;
      if (ABS(local_308) * *epsrel <= *epsabs) {
        dVar28 = *epsabs;
      }
      if ((9 < iVar10 + iVar14) || (0x13 < local_36c)) {
        *ier = 2;
        iVar13 = *last;
      }
      if (4 < iVar14) {
        local_38c = 3;
      }
      dVar35 = ABS(local_208);
      if (ABS(local_208) <= ABS(local_2f8)) {
        dVar35 = ABS(local_2f8);
      }
      dVar37 = (ABS(local_2e8) + 2.2250738585072014e-305) * 1.0000000000000222;
      if ((dVar35 <= dVar37) || (iVar13 == *limit)) {
        *ier = (uint)(dVar35 <= dVar37) * 3 + 1;
      }
      if (error2 <= error1) {
        iVar13 = *last;
        lVar7 = (long)iVar13;
        alist__[lVar7 + -1] = local_2e8;
        blist[(long)iVar15 + -1] = local_2e8;
        blist[lVar7 + -1] = local_208;
        dVar35 = error1;
      }
      else {
        alist__[(long)iVar15 + -1] = local_2e8;
        iVar13 = *last;
        lVar7 = (long)iVar13;
        alist__[lVar7 + -1] = local_2f8;
        blist[lVar7 + -1] = local_2e8;
        rlist[(long)iVar15 + -1] = area2;
        rlist[lVar7 + -1] = area1;
        uVar30 = SUB84(error1,0);
        uVar31 = (int)((ulong)error1 >> 0x20);
        dVar35 = error2;
      }
      elist[(long)iVar15 + -1] = dVar35;
      elist[lVar7 + -1] = (double)CONCAT44(uVar31,uVar30);
      if (iVar13 < 3) {
        iord[0] = 1;
        iord[1] = 2;
        lVar8 = (long)(int)uVar24;
      }
      else {
        dVar35 = elist[(long)iVar15 + -1];
        if (1 < (int)uVar24) {
          for (uVar24 = uVar24 & 0xffffffff; (int)uVar24 != 1; uVar24 = uVar24 - 1) {
            if (dVar35 <= elist[(long)iord[uVar24 - 2] + -1]) goto LAB_006b45c8;
            iord[uVar24 - 1] = iord[uVar24 - 2];
          }
          uVar24 = 1;
LAB_006b45c8:
          iVar13 = *last;
        }
        iVar5 = (*limit - iVar13) + 3;
        if (iVar13 <= *limit / 2 + 2) {
          iVar5 = iVar13;
        }
        dVar37 = elist[(long)iVar13 + -1];
        iVar13 = (int)uVar24;
        lVar8 = (long)iVar13;
        lVar17 = lVar8 << 0x20;
        lVar7 = lVar8;
        while( true ) {
          iVar13 = iVar13 + 1;
          if (iVar5 + -1 <= lVar7) break;
          if (elist[(long)iord[lVar7] + -1] <= dVar35) {
            *(int *)((long)iord + (lVar17 >> 0x1e) + -4) = iVar15;
            piVar18 = iord + (long)iVar5 + -1;
            goto LAB_006b469a;
          }
          iord[lVar7 + -1] = iord[lVar7];
          lVar17 = lVar17 + 0x100000000;
          lVar7 = lVar7 + 1;
        }
        iord[(long)(iVar5 + -1) + -1] = iVar15;
        iord[(long)iVar5 + -1] = *last;
      }
      goto LAB_006b46da;
    }
LAB_006b4ca3:
    dVar25 = *abserr;
    local_368 = local_358;
LAB_006b4cbb:
    if ((dVar25 == 1.79769313486232e+308) && (!NAN(dVar25))) goto LAB_006b4d2e;
    iVar14 = *ier;
    if (iVar14 + local_38c == 0) {
      dVar28 = *result;
LAB_006b4cde:
      if (local_1f8 < local_2b0) {
        dVar25 = ABS(local_308);
        if (ABS(local_308) <= ABS(dVar28)) {
          dVar25 = ABS(dVar28);
        }
        if (dVar25 <= defabs * 0.01) goto LAB_006b4d67;
      }
      iVar15 = 5;
      if (((dVar28 / local_308 < 0.01) || (100.0 < dVar28 / local_308)) ||
         (ABS(local_308) < local_2c8)) goto LAB_006b3f7b;
    }
    else {
      if (local_38c == 3) {
        dVar25 = dVar25 + local_368;
        *abserr = dVar25;
      }
      if (iVar14 == 0) {
        *ier = 3;
        iVar14 = 3;
      }
      dVar28 = *result;
      if (((dVar28 == 0.0) && (!NAN(dVar28))) || ((local_308 == 0.0 && (!NAN(local_308))))) {
        if (local_2c8 < dVar25) goto LAB_006b4d2e;
        if ((local_308 != 0.0) || (NAN(local_308))) goto LAB_006b4cde;
      }
      else {
        auVar26._8_8_ = local_2c8;
        auVar26._0_8_ = dVar25;
        auVar2._8_4_ = SUB84(ABS(local_308),0);
        auVar2._0_8_ = ABS(dVar28);
        auVar2._12_4_ = (int)((ulong)ABS(local_308) >> 0x20);
        auVar27 = divpd(auVar26,auVar2);
        if (auVar27._0_8_ <= auVar27._8_8_) goto LAB_006b4cde;
LAB_006b4d2e:
        *result = 0.0;
        uVar12 = 0;
        uVar20 = (ulong)(uint)*last;
        if (*last < 1) {
          uVar20 = uVar12;
        }
        dVar25 = 0.0;
        for (; uVar20 != uVar12; uVar12 = uVar12 + 1) {
          dVar25 = dVar25 + rlist[uVar12];
          *result = dVar25;
        }
        *abserr = local_2c8;
        iVar14 = *ier;
      }
    }
LAB_006b4d67:
    if (iVar14 < 3) {
      return;
    }
  }
LAB_006b3f86:
  *neval = *last * 0x2a + -0x15;
  return;
LAB_006b469a:
  if (iVar5 <= iVar13) goto LAB_006b46ba;
  if (dVar37 < elist[(long)piVar18[-1] + -1]) {
    *piVar18 = *last;
    goto LAB_006b46da;
  }
  *piVar18 = piVar18[-1];
  iVar13 = iVar13 + 1;
  piVar18 = piVar18 + -1;
  goto LAB_006b469a;
LAB_006b46ba:
  iord[lVar7] = *last;
LAB_006b46da:
  local_2c8 = (local_2c8 + dVar25) - local_218;
  if (local_2c8 <= dVar28) goto LAB_006b4d2e;
  if (*ier != 0) goto LAB_006b4ca3;
  uVar1 = iord[lVar8 + -1];
  uVar20 = (ulong)uVar1;
  uVar30 = SUB84(elist[(long)(int)uVar1 + -1],0);
  uVar31 = (undefined4)((ulong)elist[(long)(int)uVar1 + -1] >> 0x20);
  iVar15 = *last;
  if (iVar15 == 2) {
    uStack_2d0 = 0;
    local_2d8 = ABS(*local_2a0 - *local_2a8) * 0.375;
    iVar15 = 2;
    local_368 = local_2c8;
    local_350 = dVar28;
    rlist2[1] = local_308;
  }
  else if (bVar22) {
    bVar22 = true;
  }
  else {
    uVar23 = -(ulong)(local_2d8 < ABS(local_2e8 - local_2f8));
    local_368 = (double)(~uVar23 & (ulong)(local_368 - local_218) |
                        (ulong)(dVar25 + (local_368 - local_218)) & uVar23);
    if (bVar21) {
      uVar23 = uVar24 & 0xffffffff;
    }
    else {
      bVar21 = false;
      uVar23 = 2;
      if (local_2d8 < ABS(blist[(long)(int)uVar1 + -1] - alist__[(long)(int)uVar1 + -1])) {
        bVar22 = false;
        goto LAB_006b4c8b;
      }
    }
    if ((local_38c == 3) || (local_368 <= local_350)) {
LAB_006b48a8:
      uVar1 = (uint)uVar12;
      uVar11 = uVar1 + 1;
      uVar23 = (ulong)uVar11;
      rlist2[(int)uVar1] = local_308;
      if ((int)uVar1 < 2) {
        dVar35 = 1.79769313486232e+308;
        dVar28 = local_308;
      }
      else {
        rlist2[(ulong)uVar11 + 1] = local_308;
        uVar12 = uVar12 >> 1;
        rlist2[(ulong)uVar11 - 1] = 1.79769313486232e+308;
        iVar15 = (int)uVar12;
        lVar7 = 0;
        uVar30 = 0xffffffff;
        uVar31 = 0x7fefffff;
        uVar32 = 0;
        uVar33 = 0;
        dVar25 = local_308;
        while (iVar13 = (int)uVar12, uVar12 = (ulong)(iVar13 - 1), iVar13 != 0) {
          dVar28 = rlist2[(ulong)uVar11 + lVar7 + 1];
          dVar35 = adStack_1f0[(ulong)uVar11 + lVar7];
          dVar37 = (adStack_1f0 + (ulong)uVar11 + lVar7)[1];
          dVar36 = dVar37 - dVar35;
          auVar40._0_8_ = ABS(dVar35);
          dVar43 = ABS(dVar37);
          dVar34 = ABS(dVar36);
          dVar35 = ABS(dVar28 - dVar37);
          auVar40._8_8_ = dVar43;
          auVar27._8_8_ = ABS(dVar28);
          auVar27._0_8_ = dVar43;
          auVar27 = maxpd(auVar40,auVar27);
          dVar38 = auVar27._0_8_ * 2.220446049250313e-16;
          dVar42 = auVar27._8_8_ * 2.220446049250313e-16;
          if ((dVar35 <= dVar42) && (dVar34 <= dVar38)) {
            dVar35 = dVar35 + dVar34;
            goto LAB_006b4b8d;
          }
          dVar39 = rlist2[(ulong)uVar11 + lVar7 + -1];
          rlist2[(ulong)uVar11 + lVar7 + -1] = dVar37;
          dVar44 = ABS(dVar39);
          if (dVar44 <= dVar43) {
            dVar44 = dVar43;
          }
          auVar41._8_8_ = -(ulong)(dVar42 < dVar35);
          auVar41._0_8_ = -(ulong)(dVar38 < dVar34);
          uVar19 = movmskpd((int)uVar20,auVar41);
          uVar20 = (ulong)uVar19;
          if ((((uVar19 & 2) == 0) ||
              (dVar39 = dVar37 - dVar39, ABS(dVar39) <= dVar44 * 2.220446049250313e-16)) ||
             ((uVar19 & 1) == 0)) {
LAB_006b4a92:
            uVar19 = 1 - (int)lVar7;
            goto LAB_006b4aa4;
          }
          auVar4._8_8_ = dVar28 - dVar37;
          auVar4._0_8_ = dVar36;
          auVar27 = divpd(_DAT_010020a0,auVar4);
          dVar36 = (auVar27._8_8_ + 1.0 / dVar39) - auVar27._0_8_;
          if (ABS(dVar37 * dVar36) <= 0.0001) goto LAB_006b4a92;
          dVar36 = dVar37 + 1.0 / dVar36;
          rlist2[(ulong)uVar11 + lVar7 + -1] = dVar36;
          dVar34 = ABS(dVar36 - dVar28) + dVar35 + dVar34;
          if (dVar34 <= (double)CONCAT44(uVar31,uVar30)) {
            dVar25 = dVar36;
          }
          uVar24 = -(ulong)((double)CONCAT44(uVar31,uVar30) < dVar34);
          auVar29._0_8_ = uVar24 & CONCAT44(uVar31,uVar30);
          auVar29._8_8_ = (ulong)ABS(dVar37) & CONCAT44(uVar33,uVar32);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = ~uVar24 & (ulong)dVar34;
          auVar29 = auVar29 | auVar3;
          lVar7 = lVar7 + -2;
          uVar30 = auVar29._0_4_;
          uVar31 = auVar29._4_4_;
          uVar32 = auVar29._8_4_;
          uVar33 = auVar29._12_4_;
        }
        uVar19 = uVar11;
        if (uVar11 == 0x32) {
          uVar19 = 0x31;
        }
LAB_006b4aa4:
        pdVar16 = rlist2 + (ulong)(uVar1 & 1) + 2;
        iVar15 = iVar15 + 1;
        while (bVar21 = iVar15 != 0, iVar15 = iVar15 + -1, bVar21) {
          pdVar16[-2] = *pdVar16;
          pdVar16 = pdVar16 + 2;
        }
        if (uVar11 - uVar19 != 0) {
          uVar20 = 0;
          if (0 < (int)uVar19) {
            uVar20 = (ulong)uVar19;
          }
          pdVar16 = rlist2;
          while (bVar21 = uVar20 != 0, uVar20 = uVar20 - 1, bVar21) {
            *pdVar16 = pdVar16[(int)(uVar11 - uVar19)];
            pdVar16 = pdVar16 + 1;
          }
        }
        if (iVar6 < 3) {
          (&area1)[iVar6 + 1] = dVar25;
          dVar35 = 1.79769313486232e+308;
        }
        else {
          dVar35 = ABS(dVar25 - local_238) + ABS(dVar25 - dStack_228) + ABS(dVar25 - dStack_230);
          local_238 = dStack_230;
          dStack_230 = dStack_228;
          dStack_228 = dVar25;
        }
        uVar23 = (ulong)uVar19;
        dVar28 = dVar25;
      }
LAB_006b4b8d:
      dVar37 = ABS(dVar28) * 1.1102230246251565e-15;
      bVar21 = 4 < local_37c;
      dVar25 = *abserr;
      bVar22 = dVar25 < local_2c8 * 0.001;
      if (bVar22 && bVar21) {
        *ier = 5;
      }
      if (dVar37 <= dVar35) {
        dVar37 = dVar35;
      }
      if (dVar25 <= dVar37) {
        local_37c = local_37c + 1;
        local_368 = local_358;
      }
      else {
        *abserr = dVar37;
        *result = dVar28;
        local_350 = ABS(dVar28) * *epsrel;
        if (local_350 <= *epsabs) {
          local_350 = *epsabs;
        }
        dVar25 = *abserr;
        local_37c = 0;
        if (dVar25 <= local_350) goto LAB_006b4cbb;
      }
      if (bVar22 && bVar21) {
        local_358 = local_368;
        goto LAB_006b4ca3;
      }
      bVar22 = (int)uVar23 == 1;
      uVar20 = (ulong)*iord;
      uVar30 = SUB84(elist[uVar20 - 1],0);
      uVar31 = (undefined4)((ulong)elist[uVar20 - 1] >> 0x20);
      local_2d8 = local_2d8 * 0.5;
      iVar15 = *last;
      bVar21 = false;
      uVar24 = 1;
      local_358 = local_368;
      uVar12 = uVar23;
      local_368 = local_2c8;
      iVar6 = iVar6 + 1;
    }
    else {
      uVar20 = 2;
      iVar13 = (*limit - iVar15) + 3;
      if (iVar15 <= *limit / 2 + 2) {
        iVar13 = iVar15;
      }
      puVar9 = (uint *)(iord + (long)(int)uVar23 + -1);
      do {
        uVar24 = uVar23;
        if (iVar13 < (int)uVar24) goto LAB_006b48a8;
        uVar1 = *puVar9;
        uVar20 = (ulong)uVar1;
        puVar9 = puVar9 + 1;
        uVar23 = (ulong)((int)uVar24 + 1);
      } while (ABS(blist[(long)(int)uVar1 + -1] - alist__[(long)(int)uVar1 + -1]) <= local_2d8);
      uVar30 = SUB84(elist[(long)(int)uVar1 + -1],0);
      uVar31 = (undefined4)((ulong)elist[(long)(int)uVar1 + -1] >> 0x20);
      bVar22 = false;
      bVar21 = true;
    }
  }
LAB_006b4c8b:
  iVar15 = iVar15 + 1;
  goto LAB_006b40af;
}

Assistant:

GPU_FUNCTION void xc_rdqagse(integr_fn f, void *ex, double *a, double *b,
	     double *epsabs, double *epsrel, int *limit, double *result,
	     double *abserr, int *neval, int *ier, double *alist__,
	     double *blist, double *rlist, double *elist, int *iord, int *last)
{
  /* Local variables */
  int noext, extrap;
  int k,ksgn, nres;
  int ierro;
  int ktmin, nrmax;
  int iroff1, iroff2, iroff3;
  int id;
  int numrl2;
  int jupbnd;
  int maxerr;
  double res3la[3];
  double rlist2[52];
  double abseps, area, area1, area2, area12, dres, epmach;
  double a1, a2, b1, b2, defabs, defab1, defab2, oflow, uflow, resabs, reseps;
  double error1, error2, erro12, errbnd, erlast, errmax, errsum;

  double correc = 0.0, erlarg = 0.0, ertest = 0.0, small = 0.0;
  /*
 ***begin prologue  dqagse
 ***date written   800101   (yymmdd)
 ***revision date  830518   (yymmdd)
 ***category no.  h2a1a1
 ***keywords  automatic integrator, general-purpose,
              (end point) singularities, extrapolation,
              globally adaptive
 ***author  piessens,robert,appl. math. & progr. div. - k.u.leuven
            de doncker,elise,appl. math. & progr. div. - k.u.leuven
 ***purpose  the routine calculates an approximation result to a given
             definite integral i = integral of f over (a,b),
             hopefully satisfying following claim for accuracy
             abs(i-result) <= max(epsabs,epsrel*abs(i)).
 ***description

       computation of a definite integral
       standard fortran subroutine
       double precision version

       parameters
        on entry
           f      - double precision
                    function subprogram defining the integrand
                    function f(x). the actual name for f needs to be
                    declared e x t e r n a l in the driver program.

           a      - double precision
                    lower limit of integration

           b      - double precision
                    upper limit of integration

           epsabs - double precision
                    absolute accuracy requested
           epsrel - double precision
                    relative accuracy requested
                    if  epsabs <= 0
                    and epsrel < max(50*rel.mach.acc.,0.5d-28),
                    the routine will end with ier = 6.

           limit  - int
                    gives an upperbound on the number of subintervals
                    in the partition of (a,b)

        on return
           result - double precision
                    approximation to the integral

           abserr - double precision
                    estimate of the modulus of the absolute error,
                    which should equal or exceed abs(i-result)

           neval  - int
                    number of integrand evaluations

           ier    - int
                    ier = 0 normal and reliable termination of the
                            routine. it is assumed that the requested
                            accuracy has been achieved.
                    ier > 0 abnormal termination of the routine
                            the estimates for integral and error are
                            less reliable. it is assumed that the
                            requested accuracy has not been achieved.
           error messages
                        = 1 maximum number of subdivisions allowed
                            has been achieved. one can allow more sub-
                            divisions by increasing the value of limit
                            (and taking the according dimension
                            adjustments into account). however, if
                            this yields no improvement it is advised
                            to analyze the integrand in order to
                            determine the integration difficulties. if
                            the position of a local difficulty can be
                            determined (e.g. singularity,
                            discontinuity within the interval) one
                            will probably gain from splitting up the
                            interval at this point and calling the
                            integrator on the subranges. if possible,
                            an appropriate special-purpose integrator
                            should be used, which is designed for
                            handling the type of difficulty involved.
                        = 2 the occurrence of roundoff error is detec-
                            ted, which prevents the requested
                            tolerance from being achieved.
                            the error may be under-estimated.
                        = 3 extremely bad integrand behaviour
                            occurs at some points of the integration
                            interval.
                        = 4 the algorithm does not converge.
                            roundoff error is detected in the
                            extrapolation table.
                            it is presumed that the requested
                            tolerance cannot be achieved, and that the
                            returned result is the best which can be
                            obtained.
                        = 5 the integral is probably divergent, or
                            slowly convergent. it must be noted that
                            divergence can occur with any other value
                            of ier.
                        = 6 the input is invalid, because
                            epsabs <= 0 and
                            epsrel < max(50*rel.mach.acc.,0.5d-28).
                            result, abserr, neval, last, rlist(1),
                            iord(1) and elist(1) are set to zero.
                            alist(1) and blist(1) are set to a and b
                            respectively.

           alist  - double precision
                    vector of dimension at least limit, the first
                     last  elements of which are the left end points
                    of the subintervals in the partition of the
                    given integration range (a,b)

           blist  - double precision
                    vector of dimension at least limit, the first
                     last  elements of which are the right end points
                    of the subintervals in the partition of the given
                    integration range (a,b)

           rlist  - double precision
                    vector of dimension at least limit, the first
                     last  elements of which are the integral
                    approximations on the subintervals

           elist  - double precision
                    vector of dimension at least limit, the first
                     last  elements of which are the moduli of the
                    absolute error estimates on the subintervals

           iord   - int
                    vector of dimension at least limit, the first k
                    elements of which are pointers to the
                    error estimates over the subintervals,
                    such that elist(iord(1)), ..., elist(iord(k))
                    form a decreasing sequence, with k = last
                    if last <= (limit/2+2), and k = limit+1-last
                    otherwise

           last   - int
                    number of subintervals actually produced in the
                    subdivision process

 ***references  (none)
 ***routines called  dqelg,dqk21,dqpsrt
 ***end prologue  dqagse



           the dimension of rlist2 is determined by the value of
           limexp in subroutine dqelg (rlist2 should be of dimension
           (limexp+2) at least).

           list of major variables
           -----------------------

          alist     - list of left end points of all subintervals
                      considered up to now
          blist     - list of right end points of all subintervals
                      considered up to now
          rlist(i)  - approximation to the integral over
                      (alist(i),blist(i))
          rlist2    - array of dimension at least limexp+2 containing
                      the part of the epsilon table which is still
                      needed for further computations
          elist(i)  - error estimate applying to rlist(i)
          maxerr    - pointer to the interval with largest error
                      estimate
          errmax    - elist(maxerr)
          erlast    - error on the interval currently subdivided
                      (before that subdivision has taken place)
          area      - sum of the integrals over the subintervals
          errsum    - sum of the errors over the subintervals
          errbnd    - requested accuracy max(epsabs,epsrel*
                      abs(result))
          *****1    - variable for the left interval
          *****2    - variable for the right interval
          last      - index for subdivision
          nres      - number of calls to the extrapolation routine
          numrl2    - number of elements currently in rlist2. if an
                      appropriate approximation to the compounded
                      integral has been obtained it is put in
                      rlist2(numrl2) after numrl2 has been increased
                      by one.
          small     - length of the smallest interval considered up
                      to now, multiplied by 1.5
          erlarg    - sum of the errors over the intervals larger
                      than the smallest interval considered up to now
          extrap    - logical variable denoting that the routine is
                      attempting to perform extrapolation i.e. before
                      subdividing the smallest interval we try to
                      decrease the value of erlarg.
          noext     - logical variable denoting that extrapolation
                      is no longer allowed (true value)

           machine dependent constants
           ---------------------------

          epmach is the largest relative spacing.
          uflow is the smallest positive magnitude.
          oflow is the largest positive magnitude. */

  /* ***first executable statement  dqagse */
  /* Parameter adjustments */
  --iord;
  --elist;
  --rlist;
  --blist;
  --alist__;

  /* Function Body */
  epmach = DBL_EPSILON;

  /*            test on validity of parameters */
  /*            ------------------------------ */
  *ier = 0;
  *neval = 0;
  *last = 0;
  *result = 0.;
  *abserr = 0.;
  alist__[1] = *a;
  blist[1] = *b;
  rlist[1] = 0.;
  elist[1] = 0.;
  if (*epsabs <= 0. && *epsrel < m_max(epmach * 50., 5e-29)) {
    *ier = 6;
    return;
  }

  /*           first approximation to the integral */
  /*           ----------------------------------- */

  uflow = DBL_MIN;
  oflow = DBL_MAX;
  ierro = 0;
  rdqk21(f, ex, a, b, result, abserr, &defabs, &resabs);

  /*           test on accuracy. */

  dres = fabs(*result);
  errbnd = m_max(*epsabs, *epsrel * dres);
  *last = 1;
  rlist[1] = *result;
  elist[1] = *abserr;
  iord[1] = 1;
  if (*abserr <= epmach * 100. * defabs && *abserr > errbnd)
    *ier = 2;
  if (*limit == 1)
    *ier = 1;
  if (*ier != 0 || (*abserr <= errbnd && *abserr != resabs)
      || *abserr == 0.) goto L140;

  /*           initialization */
  /*           -------------- */

  rlist2[0] = *result;
  errmax = *abserr;
  maxerr = 1;
  area = *result;
  errsum = *abserr;
  *abserr = oflow;
  nrmax = 1;
  nres = 0;
  numrl2 = 2;
  ktmin = 0;
  extrap = FALSE;
  noext = FALSE;
  iroff1 = 0;
  iroff2 = 0;
  iroff3 = 0;
  ksgn = -1;
  if (dres >= (1. - epmach * 50.) * defabs) {
    ksgn = 1;
  }

  /*           main do-loop */
  /*           ------------ */

  for (*last = 2; *last <= *limit; ++(*last)) {

    /*           bisect the subinterval with the nrmax-th largest error estimate. */

    a1 = alist__[maxerr];
    b1 = (alist__[maxerr] + blist[maxerr]) * .5;
    a2 = b1;
    b2 = blist[maxerr];
    erlast = errmax;
    rdqk21(f, ex, &a1, &b1, &area1, &error1, &resabs, &defab1);
    rdqk21(f, ex, &a2, &b2, &area2, &error2, &resabs, &defab2);

    /*           improve previous approximations to integral
		 and error and test for accuracy. */

    area12 = area1 + area2;
    erro12 = error1 + error2;
    errsum = errsum + erro12 - errmax;
    area = area + area12 - rlist[maxerr];
    if (defab1 == error1 || defab2 == error2) {
      goto L15;
    }
    if (fabs(rlist[maxerr] - area12) > fabs(area12) * 1e-5 ||
	erro12 < errmax * .99) {
      goto L10;
    }
    if (extrap) {
      ++iroff2;
    }
    if (! extrap) {
      ++iroff1;
    }
  L10:
    if (*last > 10 && erro12 > errmax) {
      ++iroff3;
    }
  L15:
    rlist[maxerr] = area1;
    rlist[*last] = area2;
    errbnd = m_max(*epsabs, *epsrel * fabs(area));

    /*           test for roundoff error and eventually set error flag. */

    if (iroff1 + iroff2 >= 10 || iroff3 >= 20)
      *ier = 2;
    if (iroff2 >= 5)
      ierro = 3;

    /* set error flag in the case that the number of subintervals equals limit. */
    if (*last == *limit)
      *ier = 1;

    /*           set error flag in the case of bad integrand behaviour
		 at a point of the integration range. */

    if (m_max(fabs(a1), fabs(b2)) <=
	(epmach * 100. + 1.) * (fabs(a2) + uflow * 1e3)) {
      *ier = 4;
    }

    /*           append the newly-created intervals to the list. */

    if (error2 > error1) {
      alist__[maxerr] = a2;
      alist__[*last] = a1;
      blist[*last] = b1;
      rlist[maxerr] = area2;
      rlist[*last] = area1;
      elist[maxerr] = error2;
      elist[*last] = error1;
    } else {
      alist__[*last] = a2;
      blist[maxerr] = b1;
      blist[*last] = b2;
      elist[maxerr] = error1;
      elist[*last] = error2;
    }

    /*           call subroutine dqpsrt to maintain the descending ordering
		 in the list of error estimates and select the subinterval
		 with nrmax-th largest error estimate (to be bisected next). */

    /*L30:*/
    rdqpsrt(limit, last, &maxerr, &errmax, &elist[1], &iord[1], &nrmax);

    if (errsum <= errbnd)   goto L115;/* ***jump out of do-loop */
    if (*ier != 0)	    goto L100;/* ***jump out of do-loop */

    if (*last == 2)	    goto L80;
    if (noext)		    goto L90;

    erlarg -= erlast;
    if (fabs(b1 - a1) > small) {
      erlarg += erro12;
    }
    if (extrap) {
      goto L40;
    }

    /*           test whether the interval to be bisected next is the
		 smallest interval. */

    if (fabs(blist[maxerr] - alist__[maxerr]) > small) {
      goto L90;
    }
    extrap = TRUE;
    nrmax = 2;
  L40:
    if (ierro == 3 || erlarg <= ertest) {
      goto L60;
    }

    /*           the smallest interval has the largest error.
		 before bisecting decrease the sum of the errors over the
		 larger intervals (erlarg) and perform extrapolation. */

    id = nrmax;
    jupbnd = *last;
    if (*last > *limit / 2 + 2) {
      jupbnd = *limit + 3 - *last;
    }
    for (k = id; k <= jupbnd; ++k) {
      maxerr = iord[nrmax];
      errmax = elist[maxerr];
      if (fabs(blist[maxerr] - alist__[maxerr]) > small) {
	goto L90;/* ***jump out of do-loop */
      }
      ++nrmax;
      /* L50: */
    }

    /*           perform extrapolation. */

  L60:
    ++numrl2;
    rlist2[numrl2 - 1] = area;
    rdqelg(&numrl2, rlist2, &reseps, &abseps, res3la, &nres);
    ++ktmin;
    if (ktmin > 5 && *abserr < errsum * .001) {
      *ier = 5;
    }
    if (abseps >= *abserr) {
      goto L70;
    }
    ktmin = 0;
    *abserr = abseps;
    *result = reseps;
    correc = erlarg;
    ertest = m_max(*epsabs, *epsrel * fabs(reseps));
    if (*abserr <= ertest) {
      goto L100;/* ***jump out of do-loop */
    }

    /*           prepare bisection of the smallest interval. */

  L70:
    if (numrl2 == 1) {
      noext = TRUE;
    }
    if (*ier == 5) {
      goto L100;
    }
    maxerr = iord[1];
    errmax = elist[maxerr];
    nrmax = 1;
    extrap = FALSE;
    small *= .5;
    erlarg = errsum;
    goto L90;
  L80:
    small = fabs(*b - *a) * .375;
    erlarg = errsum;
    ertest = errbnd;
    rlist2[1] = area;
  L90:
    ;
  }


 L100:/*		set final result and error estimate. */
      /*		------------------------------------ */
  if (*abserr == oflow) 	goto L115;
  if (*ier + ierro == 0) 	goto L110;
  if (ierro == 3)
    *abserr += correc;
  if (*ier == 0)
    *ier = 3;
  if (*result != 0. && area != 0.) goto L105;
  if (*abserr > errsum) 	goto L115;
  if (area == 0.) 		goto L130;
  goto L110;

 L105:
  if (*abserr / fabs(*result) > errsum / fabs(area)) {
    goto L115;
  }

 L110:/*		test on divergence. */
  if (ksgn == -1 && m_max(fabs(*result), fabs(area)) <= defabs * .01) {
    goto L130;
  }
  if (.01 > *result / area || *result / area > 100. || errsum > fabs(area)) {
    *ier = 5;
  }
  goto L130;

 L115:/*		compute global integral sum. */
  *result = 0.;
  for (k = 1; k <= *last; ++k)
    *result += rlist[k];
  *abserr = errsum;
 L130:
  if (*ier > 2)
  L140:
    *neval = *last * 42 - 21;

  return;
}